

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

DSPOMDP * __thiscall MyPlanner::InitializeModel(MyPlanner *this,Option *options)

{
  char *__s;
  Option *pOVar1;
  DSPOMDP *local_a8;
  LaserTag *local_88;
  allocator<char> local_71;
  string local_70;
  undefined1 local_49;
  LaserTag *local_48;
  undefined1 local_29;
  LaserTag *local_28;
  DSPOMDP *model;
  Option *options_local;
  MyPlanner *this_local;
  
  model = (DSPOMDP *)options;
  options_local = (Option *)this;
  pOVar1 = despot::option::Option::operator_cast_to_Option_(options + 0x60);
  local_29 = 0;
  local_49 = 0;
  if (pOVar1 != (Option *)0x0) {
    local_88 = (LaserTag *)operator_new(0x180);
    local_49 = 1;
    __s = *(char **)(model + 0x80);
    local_48 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    despot::LaserTag::LaserTag(local_88,&local_70);
    local_49 = 0;
  }
  else {
    local_88 = (LaserTag *)operator_new(0x180);
    local_29 = 1;
    local_28 = local_88;
    despot::LaserTag::LaserTag(local_88);
  }
  local_a8 = (DSPOMDP *)0x0;
  if (local_88 != (LaserTag *)0x0) {
    local_a8 = (DSPOMDP *)&(local_88->super_BaseTag).super_BeliefMDP;
  }
  if (pOVar1 != (Option *)0x0) {
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return local_a8;
}

Assistant:

DSPOMDP* InitializeModel(option::Option* options) {
    DSPOMDP* model = !options[E_PARAMS_FILE] ?
      new LaserTag() : new LaserTag(options[E_PARAMS_FILE].arg);
    return model;
  }